

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorOr.h
# Opt level: O1

void __thiscall
llvm::ErrorOr<std::__cxx11::string>::moveAssign<std::__cxx11::string>
          (ErrorOr<std::__cxx11::string> *this,
          ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *Other)

{
  if (this != (ErrorOr<std::__cxx11::string> *)Other) {
    if (((byte)this[0x20] & 1) == 0) {
      if (*(ErrorOr<std::__cxx11::string> **)this != this + 0x10) {
        operator_delete(*(ErrorOr<std::__cxx11::string> **)this,*(long *)(this + 0x10) + 1);
      }
    }
    moveConstruct<std::__cxx11::string>(this,Other);
    return;
  }
  return;
}

Assistant:

static bool compareThisIfSameType(const T1 &a, const T1 &b) {
    return &a == &b;
  }